

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

sxi32 GenStateEmitExprCode(jx9_gen_state *pGen,jx9_expr_node *pNode,sxi32 iFlags)

{
  ProcNodeConstruct p_Var1;
  jx9_expr_op *pjVar2;
  SySet *pSVar3;
  void *pvVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  SyToken *pSVar8;
  SyToken *pSVar9;
  sxi32 sVar10;
  sxu32 sVar11;
  ulong uVar12;
  sxu32 iP2;
  sxu32 sVar13;
  long lVar14;
  jx9_expr_node *pNode_00;
  sxu32 sVar15;
  int iOp;
  sxu32 nJmp;
  sxu32 nJmpIdx;
  sxu32 nJz;
  void *local_58;
  sxu32 local_3c;
  sxu32 local_38;
  sxu32 local_34;
  
  p_Var1 = pNode->xCode;
  if (p_Var1 != (ProcNodeConstruct)0x0) {
    pSVar8 = pGen->pIn;
    pSVar9 = pGen->pEnd;
    uVar5 = *(undefined4 *)((long)&pNode->pStart + 4);
    uVar6 = *(undefined4 *)&pNode->pEnd;
    uVar7 = *(undefined4 *)((long)&pNode->pEnd + 4);
    *(undefined4 *)&pGen->pIn = *(undefined4 *)&pNode->pStart;
    *(undefined4 *)((long)&pGen->pIn + 4) = uVar5;
    *(undefined4 *)&pGen->pEnd = uVar6;
    *(undefined4 *)((long)&pGen->pEnd + 4) = uVar7;
    sVar10 = (*p_Var1)(pGen,iFlags);
    pGen->pIn = pSVar8;
    pGen->pEnd = pSVar9;
    return sVar10;
  }
  pjVar2 = pNode->pOp;
  if (pjVar2 == (jx9_expr_op *)0x0) {
    jx9GenCompileError(pGen,1,pNode->pStart->nLine,
                       "Invalid expression node, JX9 is aborting compilation");
    return -10;
  }
  if (pjVar2->iOp == 0x26) {
    sVar10 = GenStateEmitExprCode(pGen,pNode->pCond,iFlags);
    if (sVar10 != 0) {
      return sVar10;
    }
    local_3c = 0;
    local_34 = 0;
    jx9VmEmitInstr(pGen->pVm,9,0,0,(void *)0x0,&local_34);
    if ((pNode->pLeft != (jx9_expr_node *)0x0) &&
       (sVar10 = GenStateEmitExprCode(pGen,pNode->pLeft,iFlags), sVar10 != 0)) {
      return sVar10;
    }
    jx9VmEmitInstr(pGen->pVm,8,0,0,(void *)0x0,&local_3c);
    pSVar3 = pGen->pVm->pByteContainer;
    if ((local_34 < pSVar3->nUsed) && (pSVar3->pBase != (void *)0x0)) {
      *(sxu32 *)((long)pSVar3->pBase + (ulong)(local_34 * pSVar3->eSize) + 8) = pSVar3->nUsed;
    }
    if ((pNode->pRight != (jx9_expr_node *)0x0) &&
       (sVar10 = GenStateEmitExprCode(pGen,pNode->pRight,iFlags), sVar10 != 0)) {
      return sVar10;
    }
    sVar10 = 0;
    goto LAB_001287d2;
  }
  iOp = pjVar2->iVmOp;
  pNode_00 = pNode->pLeft;
  if (pNode_00 == (jx9_expr_node *)0x0) {
LAB_00128698:
    iP2 = 0;
    sVar11 = 0;
  }
  else if (iOp == 0x10) {
    sVar11 = (pNode->aNodeArgs).nUsed;
    if (0 < (int)sVar11) {
      pvVar4 = (pNode->aNodeArgs).pBase;
      lVar14 = 0;
      do {
        sVar10 = GenStateEmitExprCode(pGen,*(jx9_expr_node **)((long)pvVar4 + lVar14 * 8),2);
        if (sVar10 != 0) {
          return sVar10;
        }
        lVar14 = lVar14 + 1;
        sVar11 = (pNode->aNodeArgs).nUsed;
      } while (lVar14 < (int)sVar11);
      pNode_00 = pNode->pLeft;
    }
    iFlags = iFlags & 0xfffffffd;
    sVar10 = GenStateEmitExprCode(pGen,pNode_00,iFlags);
    if (sVar10 != 0) {
      return sVar10;
    }
    pSVar3 = pGen->pVm->pByteContainer;
    if ((pSVar3->nUsed != 0) && (pvVar4 = pSVar3->pBase, pvVar4 != (void *)0x0)) {
      uVar12 = (ulong)((pSVar3->nUsed - 1) * pSVar3->eSize);
      if (*(char *)((long)pvVar4 + uVar12) == '?') {
        *(undefined4 *)((long)pvVar4 + uVar12 + 8) = 1;
      }
      else if (*(char *)((long)pvVar4 + uVar12) == '\x04') {
        *(undefined4 *)((long)pvVar4 + uVar12 + 4) = 0;
      }
    }
    iP2 = 0;
  }
  else {
    sVar10 = GenStateEmitExprCode(pGen,pNode_00,iFlags);
    if (sVar10 != 0) {
      return sVar10;
    }
    if (iOp != 5) {
      if (pNode->pOp->iOp == 0x33) {
        jx9VmEmitInstr(pGen->pVm,0xb,1,0,(void *)0x0,(sxu32 *)0x0);
      }
      goto LAB_00128698;
    }
    sVar11 = (pNode->aNodeArgs).nUsed;
    if (0 < (int)sVar11) {
      pvVar4 = (pNode->aNodeArgs).pBase;
      lVar14 = 0;
      do {
        sVar10 = GenStateEmitExprCode
                           (pGen,*(jx9_expr_node **)((long)pvVar4 + lVar14 * 8),iFlags & 0xfffffffe)
        ;
        if (sVar10 != 0) {
          return sVar10;
        }
        lVar14 = lVar14 + 1;
        sVar11 = (pNode->aNodeArgs).nUsed;
      } while (lVar14 < (int)sVar11);
    }
    sVar11 = (sxu32)(sVar11 != 0);
    iP2 = iFlags & 1;
  }
  sVar10 = 0;
  local_38 = 0;
  if (pNode->pRight == (jx9_expr_node *)0x0) {
LAB_0012878e:
    if (iOp < 1) {
      return sVar10;
    }
    local_58 = (void *)0x0;
LAB_0012879f:
    sVar15 = sVar11;
    if ((iOp - 0x31U < 2) && (sVar15 = 1, (pNode->iFlags & 1) == 0)) {
      sVar15 = sVar11;
    }
  }
  else {
    if (iOp == 0x27) {
      sVar10 = 9;
LAB_001286cf:
      local_58 = (void *)0x0;
      jx9VmEmitInstr(pGen->pVm,sVar10,1,0,(void *)0x0,&local_38);
      sVar10 = GenStateEmitExprCode(pGen,pNode->pRight,iFlags);
      goto LAB_0012879f;
    }
    if (iOp == 0x28) {
      sVar10 = 10;
      goto LAB_001286cf;
    }
    sVar10 = GenStateEmitExprCode(pGen,pNode->pRight,iFlags | (uint)(pNode->pOp->iPrec == 0x12));
    if (iOp != 0x2a) goto LAB_0012878e;
    pSVar3 = pGen->pVm->pByteContainer;
    iOp = 0x2a;
    sVar15 = sVar11;
    if ((pSVar3->nUsed == 0) || (pvVar4 = pSVar3->pBase, pvVar4 == (void *)0x0)) {
      local_58 = (void *)0x0;
    }
    else {
      sVar13 = pSVar3->nUsed - 1;
      uVar12 = (ulong)(pSVar3->eSize * sVar13);
      if (*(char *)((long)pvVar4 + uVar12) != '?') {
        if (*(char *)((long)pvVar4 + uVar12) == '\x05') {
          sVar11 = *(sxu32 *)((long)pvVar4 + uVar12 + 4);
          iOp = 0x2b;
          local_58 = (void *)0x0;
        }
        else {
          local_58 = *(void **)((long)pvVar4 + uVar12 + 0x10);
          iOp = 0x2a;
        }
        pSVar3->nUsed = sVar13;
        goto LAB_0012879f;
      }
      local_58 = (void *)0x0;
      iP2 = 1;
    }
  }
  jx9VmEmitInstr(pGen->pVm,iOp,sVar15,iP2,local_58,(sxu32 *)0x0);
  local_3c = local_38;
LAB_001287d2:
  if (local_3c != 0) {
    pSVar3 = pGen->pVm->pByteContainer;
    if ((local_3c < pSVar3->nUsed) && (pSVar3->pBase != (void *)0x0)) {
      *(sxu32 *)((long)pSVar3->pBase + (ulong)(local_3c * pSVar3->eSize) + 8) = pSVar3->nUsed;
    }
  }
  return sVar10;
}

Assistant:

static sxi32 GenStateEmitExprCode(
	jx9_gen_state *pGen,  /* Code generator state */
	jx9_expr_node *pNode, /* Root of the expression tree */
	sxi32 iFlags /* Control flags */
	)
{
	VmInstr *pInstr;
	sxu32 nJmpIdx;
	sxi32 iP1 = 0;
	sxu32 iP2 = 0;
	void *p3  = 0;
	sxi32 iVmOp;
	sxi32 rc;
	if( pNode->xCode ){
		SyToken *pTmpIn, *pTmpEnd;
		/* Compile node */
		SWAP_DELIMITER(pGen, pNode->pStart, pNode->pEnd);
		rc = pNode->xCode(&(*pGen), iFlags);
		RE_SWAP_DELIMITER(pGen);
		return rc;
	}
	if( pNode->pOp == 0 ){
		jx9GenCompileError(&(*pGen), E_ERROR, pNode->pStart->nLine, 
			"Invalid expression node, JX9 is aborting compilation");
		return SXERR_ABORT;
	}
	iVmOp = pNode->pOp->iVmOp;
	if( pNode->pOp->iOp == EXPR_OP_QUESTY ){
		sxu32 nJz, nJmp;
		/* Ternary operator require special handling */
		/* Phase#1: Compile the condition */
		rc = GenStateEmitExprCode(&(*pGen), pNode->pCond, iFlags);
		if( rc != SXRET_OK ){
			return rc;
		}
		nJz = nJmp = 0; /* cc -O6 warning */
		/* Phase#2: Emit the false jump */
		jx9VmEmitInstr(pGen->pVm, JX9_OP_JZ, 0, 0, 0, &nJz);
		if( pNode->pLeft ){
			/* Phase#3: Compile the 'then' expression  */
			rc = GenStateEmitExprCode(&(*pGen), pNode->pLeft, iFlags);
			if( rc != SXRET_OK ){
				return rc;
			}
		}
		/* Phase#4: Emit the unconditional jump */
		jx9VmEmitInstr(pGen->pVm, JX9_OP_JMP, 0, 0, 0, &nJmp);
		/* Phase#5: Fix the false jump now the jump destination is resolved. */
		pInstr = jx9VmGetInstr(pGen->pVm, nJz);
		if( pInstr ){
			pInstr->iP2 = jx9VmInstrLength(pGen->pVm);
		}
		/* Phase#6: Compile the 'else' expression */
		if( pNode->pRight ){
			rc = GenStateEmitExprCode(&(*pGen), pNode->pRight, iFlags);
			if( rc != SXRET_OK ){
				return rc;
			}
		}
		if( nJmp > 0 ){
			/* Phase#7: Fix the unconditional jump */
			pInstr = jx9VmGetInstr(pGen->pVm, nJmp);
			if( pInstr ){
				pInstr->iP2 = jx9VmInstrLength(pGen->pVm);
			}
		}
		/* All done */
		return SXRET_OK;
	}
	/* Generate code for the left tree */
	if( pNode->pLeft ){
		if( iVmOp == JX9_OP_CALL ){
			jx9_expr_node **apNode;
			sxi32 n;
			/* Recurse and generate bytecodes for function arguments */
			apNode = (jx9_expr_node **)SySetBasePtr(&pNode->aNodeArgs);
			/* Read-only load */
			iFlags |= EXPR_FLAG_RDONLY_LOAD;
			for( n = 0 ; n < (sxi32)SySetUsed(&pNode->aNodeArgs) ; ++n ){
				rc = GenStateEmitExprCode(&(*pGen), apNode[n], iFlags&~EXPR_FLAG_LOAD_IDX_STORE);
				if( rc != SXRET_OK ){
					return rc;
				}
			}
			/* Total number of given arguments */
			iP1 = (sxi32)SySetUsed(&pNode->aNodeArgs);
			/* Remove stale flags now */
			iFlags &= ~EXPR_FLAG_RDONLY_LOAD;
		}
		rc = GenStateEmitExprCode(&(*pGen), pNode->pLeft, iFlags);
		if( rc != SXRET_OK ){
			return rc;
		}
		if( iVmOp == JX9_OP_CALL ){
			pInstr = jx9VmPeekInstr(pGen->pVm);
			if( pInstr ){
				if ( pInstr->iOp == JX9_OP_LOADC ){
					/* Prevent constant expansion */
					pInstr->iP1 = 0;
				}else if( pInstr->iOp == JX9_OP_MEMBER /* $a.b(1, 2, 3) */  ){
					/* Annonymous function call, flag that */
					pInstr->iP2 = 1;
				}
			}
		}else if( iVmOp == JX9_OP_LOAD_IDX ){
			jx9_expr_node **apNode;
			sxi32 n;
			/* Recurse and generate bytecodes for array index */
			apNode = (jx9_expr_node **)SySetBasePtr(&pNode->aNodeArgs);
			for( n = 0 ; n < (sxi32)SySetUsed(&pNode->aNodeArgs) ; ++n ){
				rc = GenStateEmitExprCode(&(*pGen), apNode[n], iFlags&~EXPR_FLAG_LOAD_IDX_STORE);
				if( rc != SXRET_OK ){
					return rc;
				}
			}
			if( SySetUsed(&pNode->aNodeArgs) > 0 ){
				iP1 = 1; /* Node have an index associated with it */
			}
			if( iFlags & EXPR_FLAG_LOAD_IDX_STORE ){
				/* Create an empty entry when the desired index is not found */
				iP2 = 1;
			}
		}else if( pNode->pOp->iOp == EXPR_OP_COMMA ){
			/* POP the left node */
			jx9VmEmitInstr(pGen->pVm, JX9_OP_POP, 1, 0, 0, 0);
		}
	}
	rc = SXRET_OK;
	nJmpIdx = 0;
	/* Generate code for the right tree */
	if( pNode->pRight ){
		if( iVmOp == JX9_OP_LAND ){
			/* Emit the false jump so we can short-circuit the logical and */
			jx9VmEmitInstr(pGen->pVm, JX9_OP_JZ, 1/* Keep the value on the stack */, 0, 0, &nJmpIdx);
		}else if (iVmOp == JX9_OP_LOR ){
			/* Emit the true jump so we can short-circuit the logical or*/
			jx9VmEmitInstr(pGen->pVm, JX9_OP_JNZ, 1/* Keep the value on the stack */, 0, 0, &nJmpIdx);
		}else if( pNode->pOp->iPrec == 18 /* Combined binary operators [i.e: =, '.=', '+=', *=' ...] precedence */ ){
			iFlags |= EXPR_FLAG_LOAD_IDX_STORE;
		}
		rc = GenStateEmitExprCode(&(*pGen), pNode->pRight, iFlags);
		if( iVmOp == JX9_OP_STORE ){
			pInstr = jx9VmPeekInstr(pGen->pVm);
			if( pInstr ){
				if(pInstr->iOp == JX9_OP_MEMBER ){
					/* Perform a member store operation [i.e: $this.x = 50] */
					iP2 = 1;
				}else{
					if( pInstr->iOp == JX9_OP_LOAD_IDX ){
						/* Transform the STORE instruction to STORE_IDX instruction */
						iVmOp = JX9_OP_STORE_IDX;
						iP1 = pInstr->iP1;
					}else{
						p3 = pInstr->p3;
					}
					/* POP the last dynamic load instruction */
					(void)jx9VmPopInstr(pGen->pVm);
				}
			}
		}
	}
	if( iVmOp > 0 ){
		if( iVmOp == JX9_OP_INCR || iVmOp == JX9_OP_DECR ){
			if( pNode->iFlags & EXPR_NODE_PRE_INCR ){
				/* Pre-increment/decrement operator [i.e: ++$i, --$j ] */
				iP1 = 1;
			}
		}
		/* Finally, emit the VM instruction associated with this operator */
		jx9VmEmitInstr(pGen->pVm, iVmOp, iP1, iP2, p3, 0);
		if( nJmpIdx > 0 ){
			/* Fix short-circuited jumps now the destination is resolved */
			pInstr = jx9VmGetInstr(pGen->pVm, nJmpIdx);
			if( pInstr ){
				pInstr->iP2 = jx9VmInstrLength(pGen->pVm);
			}
		}
	}
	return rc;
}